

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

deque<Diff,_std::allocator<Diff>_> * __thiscall
diff_match_patch_test::diffList
          (deque<Diff,_std::allocator<Diff>_> *__return_storage_ptr__,diff_match_patch_test *this,
          Diff *d1,Diff *d2,Diff *d3,Diff *d4,Diff *d5,Diff *d6,Diff *d7,Diff *d8,Diff *d9,Diff *d10
          )

{
  ulong uVar1;
  Diff *d4_local;
  Diff *d3_local;
  Diff *d2_local;
  Diff *d1_local;
  diff_match_patch_test *this_local;
  deque<Diff,_std::allocator<Diff>_> *listRet;
  
  std::deque<Diff,_std::allocator<Diff>_>::deque(__return_storage_ptr__);
  if (((((d1->operation != Insert) || (uVar1 = std::__cxx11::wstring::empty(), (uVar1 & 1) == 0)) &&
       ((std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d1),
        d2->operation != Insert || (uVar1 = std::__cxx11::wstring::empty(), (uVar1 & 1) == 0)))) &&
      ((((std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d2),
         d3->operation != Insert || (uVar1 = std::__cxx11::wstring::empty(), (uVar1 & 1) == 0)) &&
        ((std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d3),
         d4->operation != Insert || (uVar1 = std::__cxx11::wstring::empty(), (uVar1 & 1) == 0)))) &&
       ((((std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d4),
          d5->operation != Insert || (uVar1 = std::__cxx11::wstring::empty(), (uVar1 & 1) == 0)) &&
         ((std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d5),
          d6->operation != Insert || (uVar1 = std::__cxx11::wstring::empty(), (uVar1 & 1) == 0))))
        && ((std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d6),
            d7->operation != Insert || (uVar1 = std::__cxx11::wstring::empty(), (uVar1 & 1) == 0))))
       )))) && (((std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d7),
                 d8->operation != Insert ||
                 (uVar1 = std::__cxx11::wstring::empty(), (uVar1 & 1) == 0)) &&
                (((std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d8),
                  d9->operation != Insert ||
                  (uVar1 = std::__cxx11::wstring::empty(), (uVar1 & 1) == 0)) &&
                 ((std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d9),
                  d10->operation != Insert ||
                  (uVar1 = std::__cxx11::wstring::empty(), (uVar1 & 1) == 0)))))))) {
    std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d10);
  }
  return __return_storage_ptr__;
}

Assistant:

std::deque<Diff> diff_match_patch_test::diffList(Diff d1, Diff d2, Diff d3, Diff d4, Diff d5,
  Diff d6, Diff d7, Diff d8, Diff d9, Diff d10) {
  // Diff(Diff::Operation::Insert, NULL) is invalid and thus is used as the default argument.
  std::deque<Diff> listRet;
  if (d1.operation == Diff::Operation::Insert && d1.text.empty()) {
    return listRet;
  }
  listRet.push_back(d1);

  if (d2.operation == Diff::Operation::Insert && d2.text.empty()) {
    return listRet;
  }
  listRet.push_back(d2);

  if (d3.operation == Diff::Operation::Insert && d3.text.empty()) {
    return listRet;
  }
  listRet.push_back(d3);

  if (d4.operation == Diff::Operation::Insert && d4.text.empty()) {
    return listRet;
  }
  listRet.push_back(d4);

  if (d5.operation == Diff::Operation::Insert && d5.text.empty()) {
    return listRet;
  }
  listRet.push_back(d5);

  if (d6.operation == Diff::Operation::Insert && d6.text.empty()) {
    return listRet;
  }
  listRet.push_back(d6);

  if (d7.operation == Diff::Operation::Insert && d7.text.empty()) {
    return listRet;
  }
  listRet.push_back(d7);

  if (d8.operation == Diff::Operation::Insert && d8.text.empty()) {
    return listRet;
  }
  listRet.push_back(d8);

  if (d9.operation == Diff::Operation::Insert && d9.text.empty()) {
    return listRet;
  }
  listRet.push_back(d9);

  if (d10.operation == Diff::Operation::Insert && d10.text.empty()) {
    return listRet;
  }
  listRet.push_back(d10);

  return listRet;
}